

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>_>::dispose
          (Own<kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>_> *this)

{
  WeakFulfiller<capnp::AnyPointer::Pipeline> *object;
  WeakFulfiller<capnp::AnyPointer::Pipeline> *ptrCopy;
  Own<kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>_> *this_local;
  
  object = this->ptr;
  if (object != (WeakFulfiller<capnp::AnyPointer::Pipeline> *)0x0) {
    this->ptr = (WeakFulfiller<capnp::AnyPointer::Pipeline> *)0x0;
    Disposer::dispose<kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>>(this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }